

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
HdmiCecSimulationDataGenerator::GenBit(HdmiCecSimulationDataGenerator *this,bool value,bool ackBit)

{
  undefined4 local_24;
  undefined1 local_11;
  float risingTime;
  bool ackBit_local;
  bool value_local;
  HdmiCecSimulationDataGenerator *this_local;
  
  local_11 = value;
  if (ackBit) {
    local_11 = (value ^ 0xffU) & 1;
  }
  local_24 = 0.6;
  if ((local_11 & 1) == 0) {
    local_24 = 1.5;
  }
  SimulationChannelDescriptor::TransitionIfNeeded((int)this + 0x10);
  Advance(this,local_24);
  SimulationChannelDescriptor::Transition();
  Advance(this,2.4 - local_24);
  return;
}

Assistant:

void HdmiCecSimulationDataGenerator::GenBit( bool value, bool ackBit )
{
    // Timing values are inverted for the follower-asserted ACK bit
    if( ackBit )
        value = !value;
    // Timing values from CEC 1.3a section 5.2.2 "Data Bit Timing"
    const float risingTime = value ? HdmiCec::Tim_Bit_One : HdmiCec::Tim_Bit_Zero;

    // We should be in LOW
    mCecSimulationData.TransitionIfNeeded( BIT_LOW );

    Advance( risingTime );
    mCecSimulationData.Transition(); // LOW to HIGH

    Advance( HdmiCec::Tim_Bit_Len - risingTime );
}